

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  cmGeneratorTarget *pcStack_18;
  bool has_ptx_extension;
  cmGeneratorTarget *this_local;
  
  pcStack_18 = this;
  if (GetCustomObjectExtension()::extension_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetCustomObjectExtension()::extension_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&GetCustomObjectExtension()::extension_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&GetCustomObjectExtension()::extension_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetCustomObjectExtension()::extension_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CUDA_PTX_COMPILATION",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    local_19 = bVar1;
    std::__cxx11::string::operator=
              ((string *)&GetCustomObjectExtension()::extension_abi_cxx11_,".ptx");
    this_local = (cmGeneratorTarget *)std::__cxx11::string::c_str();
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  static std::string extension;
  const bool has_ptx_extension =
    this->GetPropertyAsBool("CUDA_PTX_COMPILATION");
  if (has_ptx_extension) {
    extension = ".ptx";
    return extension.c_str();
  }
  return nullptr;
}